

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O2

Vec_Ptr_t * Saig_ManBmcSupergate(Aig_Man_t *p,int iPo)

{
  Vec_Ptr_t *vSuper;
  Aig_Obj_t *pAVar1;
  
  vSuper = Vec_PtrAlloc(10);
  pAVar1 = Aig_ManCo(p,iPo);
  pAVar1 = pAVar1->pFanin0;
  if ((((ulong)pAVar1 & 1) == 0) ||
     (pAVar1 = (Aig_Obj_t *)((ulong)pAVar1 & 0xfffffffffffffffe),
     (*(uint *)&pAVar1->field_0x18 & 7) - 7 < 0xfffffffe)) {
    Vec_PtrPush(vSuper,pAVar1);
  }
  else {
    Saig_ManBmcSupergate_rec(pAVar1->pFanin0,vSuper);
    Saig_ManBmcSupergate_rec(pAVar1->pFanin1,vSuper);
  }
  return vSuper;
}

Assistant:

Vec_Ptr_t * Saig_ManBmcSupergate( Aig_Man_t * p, int iPo )
{
    Vec_Ptr_t * vSuper;
    Aig_Obj_t * pObj;
    vSuper = Vec_PtrAlloc( 10 );
    pObj = Aig_ManCo( p, iPo );
    pObj = Aig_ObjChild0( pObj );
    if ( !Aig_IsComplement(pObj) )
    {
        Vec_PtrPush( vSuper, pObj );
        return vSuper;
    }
    pObj = Aig_Regular( pObj );
    if ( !Aig_ObjIsNode(pObj) )
    {
        Vec_PtrPush( vSuper, pObj );
        return vSuper;
    }
    Saig_ManBmcSupergate_rec( Aig_ObjChild0(pObj), vSuper );
    Saig_ManBmcSupergate_rec( Aig_ObjChild1(pObj), vSuper );
    return vSuper;
}